

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O0

RefToken CommonToken::factory(void)

{
  CommonToken *in_RDI;
  RefCount<Token> *unaff_retaddr;
  CommonToken *this;
  CommonToken *p;
  
  this = in_RDI;
  p = in_RDI;
  operator_new(0x30);
  CommonToken(this);
  RefCount<Token>::RefCount(unaff_retaddr,&p->super_Token);
  return (RefToken)(Ref *)in_RDI;
}

Assistant:

RefToken CommonToken::factory()
{
	return RefToken(new CommonToken);
}